

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_unpk_16_rr(void)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    uVar2 = m68ki_cpu.dar[m68ki_cpu.ir & 7];
    uVar4 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
    uVar1 = *(ushort *)((long)m68ki_cpu.dar + uVar4 + 2);
    uVar3 = m68ki_read_imm_16();
    *(uint *)((long)m68ki_cpu.dar + uVar4) =
         uVar3 + (uVar2 & 0xf | (uVar2 & 0xf0) << 4) & 0xffff | (uint)uVar1 << 0x10;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_unpk_16_rr(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		/* Note: DX and DY are reversed in Motorola's docs */
		uint src = DY;
		uint* r_dst = &DX;

		*r_dst = MASK_OUT_BELOW_16(*r_dst) | (((((src << 4) & 0x0f00) | (src & 0x000f)) + OPER_I_16()) & 0xffff);
		return;
	}
	m68ki_exception_illegal();
}